

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O2

void __thiscall
trng::correlated_normal_dist<double>::param_type::param_type<double_const*>
          (param_type *this,double *first,double *last)

{
  ulong uVar1;
  size_type i;
  double dVar2;
  
  dVar2 = (double)((long)last - (long)first >> 3);
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  this->d_ = uVar1;
  std::vector<double,_std::allocator<double>_>::reserve(&this->H_,uVar1 * uVar1);
  for (uVar1 = 0; uVar1 < this->d_ * this->d_; uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back(&this->H_,first);
    first = first + 1;
  }
  Cholesky_factorization(this);
  return;
}

Assistant:

explicit param_type(iter first, iter last) {
        d_ = static_cast<size_type>(
            trng::math::sqrt(static_cast<result_type>(std::distance(first, last))));
        H_.reserve(d_ * d_);
        for (size_type i{0}; i < d_ * d_; ++i, ++first)
          H_.push_back(*first);
        Cholesky_factorization();
      }